

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::coTest(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *__return_storage_ptr__,
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int i,Status stat)

{
  type_conflict5 tVar1;
  cpp_dec_float<100U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  cpp_dec_float<100U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c8;
  cpp_dec_float<100U,_int,_void> local_78;
  
  local_c8.m_backend.fpclass = cpp_dec_float_finite;
  local_c8.m_backend.prec_elem = 0x10;
  local_c8.m_backend.data._M_elems[0] = 0;
  local_c8.m_backend.data._M_elems[1] = 0;
  local_c8.m_backend.data._M_elems[2] = 0;
  local_c8.m_backend.data._M_elems[3] = 0;
  local_c8.m_backend.data._M_elems[0xc] = 0;
  local_c8.m_backend.data._M_elems[0xd] = 0;
  local_c8.m_backend.data._M_elems._56_5_ = 0;
  local_c8.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_c8.m_backend.exp = 0;
  local_c8.m_backend.neg = false;
  local_c8.m_backend.data._M_elems[4] = 0;
  local_c8.m_backend.data._M_elems[5] = 0;
  local_c8.m_backend.data._M_elems[6] = 0;
  local_c8.m_backend.data._M_elems[7] = 0;
  local_c8.m_backend.data._M_elems[8] = 0;
  local_c8.m_backend.data._M_elems[9] = 0;
  local_c8.m_backend.data._M_elems[10] = 0;
  local_c8.m_backend.data._M_elems[0xb] = 0;
  switch(stat) {
  case D_FREE:
  case D_ON_BOTH:
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 0x10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems[6] = 0;
    local_78.data._M_elems[7] = 0;
    local_78.data._M_elems[8] = 0;
    local_78.data._M_elems[9] = 0;
    local_78.data._M_elems[10] = 0;
    local_78.data._M_elems[0xb] = 0;
    local_78.data._M_elems[0xc] = 0;
    local_78.data._M_elems[0xd] = 0;
    local_78.data._M_elems._56_5_ = 0;
    local_78.data._M_elems[0xf]._1_3_ = 0;
    local_78.exp = 0;
    local_78.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_78,
               &(this->theCoPvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    local_c8.m_backend.data._M_elems[0xc] = local_78.data._M_elems[0xc];
    local_c8.m_backend.data._M_elems[0xd] = local_78.data._M_elems[0xd];
    local_c8.m_backend.data._M_elems._56_5_ = local_78.data._M_elems._56_5_;
    local_c8.m_backend.data._M_elems[0xf]._1_3_ = local_78.data._M_elems[0xf]._1_3_;
    local_c8.m_backend.data._M_elems[8] = local_78.data._M_elems[8];
    local_c8.m_backend.data._M_elems[9] = local_78.data._M_elems[9];
    local_c8.m_backend.data._M_elems[10] = local_78.data._M_elems[10];
    local_c8.m_backend.data._M_elems[0xb] = local_78.data._M_elems[0xb];
    local_c8.m_backend.data._M_elems[4] = local_78.data._M_elems[4];
    local_c8.m_backend.data._M_elems[5] = local_78.data._M_elems[5];
    local_c8.m_backend.data._M_elems[6] = local_78.data._M_elems[6];
    local_c8.m_backend.data._M_elems[7] = local_78.data._M_elems[7];
    local_c8.m_backend.data._M_elems[0] = local_78.data._M_elems[0];
    local_c8.m_backend.data._M_elems[1] = local_78.data._M_elems[1];
    local_c8.m_backend.data._M_elems[2] = local_78.data._M_elems[2];
    local_c8.m_backend.data._M_elems[3] = local_78.data._M_elems[3];
    local_c8.m_backend.exp = local_78.exp;
    local_c8.m_backend.neg = local_78.neg;
    local_c8.m_backend.fpclass = local_78.fpclass;
    local_c8.m_backend.prec_elem = local_78.prec_elem;
    local_78.data._M_elems._0_8_ = local_78.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar1 = boost::multiprecision::operator<(&local_c8,(int *)&local_78);
    if (tVar1) {
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
           local_c8.m_backend.data._M_elems._48_8_;
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_c8.m_backend.data._M_elems[0xf]._1_3_,
                    local_c8.m_backend.data._M_elems._56_5_);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           local_c8.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
           local_c8.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_c8.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           local_c8.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_c8.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_c8.m_backend.data._M_elems._8_8_;
      (__return_storage_ptr__->m_backend).exp = local_c8.m_backend.exp;
      (__return_storage_ptr__->m_backend).neg = local_c8.m_backend.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_c8.m_backend.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_c8.m_backend.prec_elem;
      return __return_storage_ptr__;
    }
    goto LAB_002f7cfb;
  case D_ON_UPPER:
    u = &(this->theCoPvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .low.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  case D_ON_LOWER:
LAB_002f7cfb:
    u = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .up.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->theCoPvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x10;
    goto LAB_002f7d83;
  case P_ON_LOWER:
    u = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .object.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->theCoPvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    break;
  default:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    return __return_storage_ptr__;
  case P_ON_UPPER:
    u = &(this->theCoPvec->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    v = &(this->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .object.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  }
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
LAB_002f7d83:
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&__return_storage_ptr__->m_backend,u,v);
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::coTest(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
      assert(rep() == ROW);
      x = (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return SPxLPBase<R>::upper(i) - (*theCoPvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return (*theCoPvec)[i] - this->maxRowObj(i);             // slacks !

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return this->maxRowObj(i) - (*theCoPvec)[i];             // slacks !

   default:
      return 0;
   }
}